

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O1

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::genAnnotations
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,Schema schema)

{
  Reader brand;
  undefined1 auVar1 [40];
  Reader list;
  Schema scope;
  uint64_t id;
  Reader proto;
  Reader local_a0;
  Schema local_70;
  ListReader local_68;
  PointerReader local_38;
  
  local_70.raw = schema.raw;
  Schema::getProto(&local_a0,&local_70);
  if (local_a0._reader.pointerCount < 3) {
    local_a0._reader.nestingLimit = 0x7fffffff;
    local_a0._reader.capTable = (CapTableReader *)0x0;
    local_38.pointer = (WirePointer *)0x0;
    local_a0._reader.segment = (SegmentReader *)0x0;
  }
  else {
    local_38.pointer = local_a0._reader.pointers + 2;
  }
  id = 0;
  local_38.segment = local_a0._reader.segment;
  local_38.capTable = local_a0._reader.capTable;
  local_38.nestingLimit = local_a0._reader.nestingLimit;
  _::PointerReader::getList(&local_68,&local_38,INLINE_COMPOSITE,(word *)0x0);
  if (0xbf < local_a0._reader.dataSize) {
    id = *(uint64_t *)((long)local_a0._reader.data + 0x10);
  }
  auVar1 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand._reader.data = (void *)auVar1._16_8_;
  brand._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand._reader.dataSize = auVar1._32_4_;
  brand._reader.pointerCount = auVar1._36_2_;
  brand._reader._38_2_ = auVar1._38_2_;
  scope = SchemaLoader::get(&this->schemaLoader,id,brand,(Schema)0x1c9ce0);
  list.reader.capTable = local_68.capTable;
  list.reader.segment = local_68.segment;
  list.reader.ptr = local_68.ptr;
  list.reader.elementCount = local_68.elementCount;
  list.reader.step = local_68.step;
  list.reader.structDataSize = local_68.structDataSize;
  list.reader.structPointerCount = local_68.structPointerCount;
  list.reader.elementSize = local_68.elementSize;
  list.reader._39_1_ = local_68._39_1_;
  list.reader.nestingLimit = local_68.nestingLimit;
  list.reader._44_4_ = local_68._44_4_;
  genAnnotations(__return_storage_ptr__,this,list,scope);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree genAnnotations(Schema schema) {
    auto proto = schema.getProto();
    return genAnnotations(proto.getAnnotations(), schemaLoader.get(proto.getScopeId()));
  }